

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_parse_session_ticket_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_ssl_session *session_00;
  int iVar1;
  mbedtls_ssl_handshake_params *extraout_RAX;
  mbedtls_ssl_handshake_params *extraout_RAX_00;
  mbedtls_ssl_handshake_params *pmVar2;
  long lVar3;
  mbedtls_ssl_handshake_params *extraout_RAX_01;
  char *format;
  mbedtls_ssl_session session;
  mbedtls_ssl_session local_b8;
  
  mbedtls_ssl_session_init(&local_b8);
  pmVar2 = (mbedtls_ssl_handshake_params *)ssl->conf;
  if (((_func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_size_t *)(pmVar2->dhm_ctx).RP.n !=
       (_func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_size_t *)0x0) &&
     (*(_func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_uchar_ptr_size_t_ptr_uint32_t_ptr **)
       &(pmVar2->dhm_ctx).RP !=
      (_func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_uchar_ptr_size_t_ptr_uint32_t_ptr *)0x0)
     ) {
    ssl->handshake->new_session_ticket = 1;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x1c9,"ticket length: %d",len);
    pmVar2 = extraout_RAX;
    if (len != 0) {
      if (ssl->renego_status == 0) {
        iVar1 = (*ssl->conf->f_ticket_parse)(ssl->conf->p_ticket,&local_b8,buf,len);
        if (iVar1 == 0) {
          session_00 = ssl->session_negotiate;
          local_b8.id_len = session_00->id_len;
          memcpy(local_b8.id,session_00->id,local_b8.id_len);
          mbedtls_ssl_session_free(session_00);
          memcpy(ssl->session_negotiate,&local_b8,0x98);
          lVar3 = 0;
          do {
            local_b8.id[lVar3 + -0x18] = '\0';
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x98);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0x1f5,"session successfully restored from ticket");
          pmVar2 = ssl->handshake;
          pmVar2->resume = 1;
          pmVar2->new_session_ticket = 0;
          goto LAB_0012778d;
        }
        mbedtls_ssl_session_free(&local_b8);
        if (iVar1 == -0x6d80) {
          format = "ticket is expired";
          iVar1 = 0x1e1;
        }
        else {
          if (iVar1 != -0x7180) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x1e3,"mbedtls_ssl_ticket_parse",iVar1);
            pmVar2 = extraout_RAX_01;
            goto LAB_0012778d;
          }
          format = "ticket is not authentic";
          iVar1 = 0x1df;
        }
      }
      else {
        format = "ticket rejected: renegotiating";
        iVar1 = 0x1d1;
      }
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,iVar1,format);
      pmVar2 = extraout_RAX_00;
    }
  }
LAB_0012778d:
  return (int)pmVar2;
}

Assistant:

static int ssl_parse_session_ticket_ext( mbedtls_ssl_context *ssl,
                                         unsigned char *buf,
                                         size_t len )
{
    int ret;
    mbedtls_ssl_session session;

    mbedtls_ssl_session_init( &session );

    if( ssl->conf->f_ticket_parse == NULL ||
        ssl->conf->f_ticket_write == NULL )
    {
        return( 0 );
    }

    /* Remember the client asked us to send a new ticket */
    ssl->handshake->new_session_ticket = 1;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ticket length: %d", len ) );

    if( len == 0 )
        return( 0 );

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if( ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ticket rejected: renegotiating" ) );
        return( 0 );
    }
#endif /* MBEDTLS_SSL_RENEGOTIATION */

    /*
     * Failures are ok: just ignore the ticket and proceed.
     */
    if( ( ret = ssl->conf->f_ticket_parse( ssl->conf->p_ticket, &session,
                                           buf, len ) ) != 0 )
    {
        mbedtls_ssl_session_free( &session );

        if( ret == MBEDTLS_ERR_SSL_INVALID_MAC )
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "ticket is not authentic" ) );
        else if( ret == MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED )
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "ticket is expired" ) );
        else
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_ticket_parse", ret );

        return( 0 );
    }

    /*
     * Keep the session ID sent by the client, since we MUST send it back to
     * inform them we're accepting the ticket  (RFC 5077 section 3.4)
     */
    session.id_len = ssl->session_negotiate->id_len;
    memcpy( &session.id, ssl->session_negotiate->id, session.id_len );

    mbedtls_ssl_session_free( ssl->session_negotiate );
    memcpy( ssl->session_negotiate, &session, sizeof( mbedtls_ssl_session ) );

    /* Zeroize instead of free as we copied the content */
    mbedtls_zeroize( &session, sizeof( mbedtls_ssl_session ) );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "session successfully restored from ticket" ) );

    ssl->handshake->resume = 1;

    /* Don't send a new ticket after all, this one is OK */
    ssl->handshake->new_session_ticket = 0;

    return( 0 );
}